

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SockData.cpp
# Opt level: O0

SockData * AGSSock::SockData_Create(ags_t size,ags_t byte)

{
  SockData *this;
  SockData *data;
  ags_t byte_local;
  ags_t size_local;
  
  this = (SockData *)operator_new(0x20);
  data._0_1_ = (char)byte;
  SockData::SockData(this,size,(char)data);
  (**(code **)(*AGSSockAPI::engine + 0x220))(AGSSockAPI::engine,this,&agsSockData);
  return this;
}

Assistant:

SockData *SockData_Create(ags_t size, ags_t byte)
{
	SockData *data = new SockData(size, byte);
	AGS_OBJECT(SockData, data);
	return data;
}